

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O2

uint32_t farmhash32_mk_len_13_to_24(char *s,size_t len,uint32_t seed)

{
  int iVar1;
  uint32_t a;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  
  uVar5 = *(uint32_t *)(s + (len - 8));
  iVar1 = *(int *)(s + (len - 4));
  a = *(uint32_t *)s;
  uVar2 = *(uint *)(s + 4);
  iVar3 = *(int *)(s + (len >> 1));
  uVar6 = (*(uint *)(s + ((len >> 1) - 4)) >> 0xc | *(uint *)(s + ((len >> 1) - 4)) << 0x14) + iVar1
  ;
  uVar4 = mur(uVar5,(int)len + seed + iVar3 * -0x3361d2af);
  iVar7 = (uVar6 >> 3 | uVar6 * 0x20000000) + uVar5;
  uVar5 = mur(a,uVar4 + uVar6);
  uVar6 = iVar7 + iVar1;
  uVar5 = mur(seed ^ uVar2,uVar5 + iVar7);
  uVar5 = fmix((uVar6 >> 0xc | uVar6 * 0x100000) + iVar3 + uVar5);
  return uVar5;
}

Assistant:

static inline uint32_t farmhash32_mk_len_13_to_24(const char *s, size_t len, uint32_t seed) {
  uint32_t a = fetch32(s - 4 + (len >> 1));
  uint32_t b = fetch32(s + 4);
  uint32_t c = fetch32(s + len - 8);
  uint32_t d = fetch32(s + (len >> 1));
  uint32_t e = fetch32(s);
  uint32_t f = fetch32(s + len - 4);
  uint32_t h = d * c1 + len + seed;
  a = ror32(a, 12) + f;
  h = mur(c, h) + a;
  a = ror32(a, 3) + c;
  h = mur(e, h) + a;
  a = ror32(a + f, 12) + d;
  h = mur(b ^ seed, h) + a;
  return fmix(h);
}